

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::print(ANN *this,uint index)

{
  uint uVar1;
  const_reference pvVar2;
  Perceptron *pPVar3;
  string *psVar4;
  ostream *poVar5;
  double dVar6;
  undefined1 local_d0 [8];
  Perceptron perceptron_1;
  uint local_6c;
  undefined1 local_68 [4];
  uint i;
  Perceptron perceptron;
  uint index_local;
  ANN *this_local;
  
  perceptron.m_label.field_2._12_4_ = index;
  Perceptron::Perceptron((Perceptron *)local_68);
  local_6c = 0;
  while( true ) {
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(uint)perceptron.m_label.field_2._12_4_);
    uVar1 = Layer::get_nb_perceptrons(pvVar2);
    if (uVar1 <= local_6c) break;
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(uint)perceptron.m_label.field_2._12_4_);
    pPVar3 = Layer::get_perceptron(pvVar2,local_6c);
    Perceptron::Perceptron((Perceptron *)local_d0,pPVar3);
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(uint)perceptron.m_label.field_2._12_4_);
    psVar4 = Layer::label_abi_cxx11_(pvVar2,local_6c);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,": ");
    dVar6 = Perceptron::get_output((Perceptron *)local_d0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar6);
    std::operator<<(poVar5,'\n');
    Perceptron::~Perceptron((Perceptron *)local_d0);
    local_6c = local_6c + 1;
  }
  Perceptron::~Perceptron((Perceptron *)local_68);
  return;
}

Assistant:

void ANN::print(uint index) const{
    Perceptron perceptron;
    for(uint i=0;i<m_layers[index].get_nb_perceptrons();++i){
        const Perceptron perceptron=m_layers[index].get_perceptron(i);
        std::cout<<m_layers[index].label(i)<<": "<<perceptron.get_output()<<'\n';
    }
}